

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgQuaternion.cpp
# Opt level: O3

void __thiscall dgQuaternion::dgQuaternion(dgQuaternion *this,dgMatrix *matrix)

{
  float fVar1;
  QUAT_INDEX i;
  QUAT_INDEX i_00;
  float fVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  float *pfVar5;
  int i_01;
  dgTemplateVector<float> *this_00;
  dgTemplateVector<float> *this_01;
  ulong uVar6;
  dgTemplateVector<float> *this_02;
  float fVar7;
  float fVar8;
  
  fVar7 = (matrix->m_front).super_dgTemplateVector<float>.m_x;
  fVar8 = (matrix->m_up).super_dgTemplateVector<float>.m_y;
  fVar1 = (matrix->m_right).super_dgTemplateVector<float>.m_z;
  fVar2 = fVar7 + fVar8 + fVar1;
  if (fVar2 <= 0.0) {
    bVar4 = fVar7 < fVar8;
    pfVar5 = dgTemplateVector<float>::operator[]
                       (&(&matrix->m_front)[bVar4].super_dgTemplateVector<float>,(uint)bVar4);
    uVar6 = 2;
    if (fVar1 <= *pfVar5) {
      uVar6 = (ulong)bVar4;
    }
    i = dgQuaternion::QIndex[uVar6];
    i_01 = (int)uVar6;
    this_00 = (dgTemplateVector<float> *)
              ((long)&(matrix->m_front).super_dgTemplateVector<float>.m_x + (ulong)(uint)(i_01 << 4)
              );
    i_00 = dgQuaternion::QIndex[i];
    pfVar5 = dgTemplateVector<float>::operator[](this_00,i_01);
    fVar7 = *pfVar5;
    this_01 = &(&matrix->m_front)[i].super_dgTemplateVector<float>;
    pfVar5 = dgTemplateVector<float>::operator[](this_01,i);
    fVar8 = *pfVar5;
    this_02 = &(&matrix->m_front)[i_00].super_dgTemplateVector<float>;
    pfVar5 = dgTemplateVector<float>::operator[](this_02,i_00);
    fVar7 = ((fVar7 + 1.0) - fVar8) - *pfVar5;
    if (fVar7 < 0.0) {
      fVar7 = sqrtf(fVar7);
    }
    else {
      auVar3 = vsqrtss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7));
      fVar7 = auVar3._0_4_;
    }
    fVar8 = 0.5 / fVar7;
    (&this->m_q1)[uVar6] = (HaF32)(fVar7 * 0.5);
    pfVar5 = dgTemplateVector<float>::operator[](this_01,i_00);
    fVar7 = *pfVar5;
    pfVar5 = dgTemplateVector<float>::operator[](this_02,i);
    this->m_q0 = (HaF32)((fVar7 - *pfVar5) * fVar8);
    pfVar5 = dgTemplateVector<float>::operator[](this_00,i);
    fVar7 = *pfVar5;
    pfVar5 = dgTemplateVector<float>::operator[](this_01,i_01);
    (&this->m_q1)[i] = (HaF32)((fVar7 + *pfVar5) * fVar8);
    pfVar5 = dgTemplateVector<float>::operator[](this_00,i_00);
    fVar7 = *pfVar5;
    pfVar5 = dgTemplateVector<float>::operator[](this_02,i_01);
    (&this->m_q1)[i_00] = (HaF32)((fVar7 + *pfVar5) * fVar8);
  }
  else {
    fVar2 = fVar2 + 1.0;
    if (fVar2 < 0.0) {
      fVar7 = sqrtf(fVar2);
    }
    else {
      auVar3 = vsqrtss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2));
      fVar7 = auVar3._0_4_;
    }
    fVar8 = 0.5 / fVar7;
    this->m_q0 = (HaF32)(fVar7 * 0.5);
    this->m_q1 = (HaF32)(fVar8 * ((matrix->m_up).super_dgTemplateVector<float>.m_z -
                                 (matrix->m_right).super_dgTemplateVector<float>.m_y));
    this->m_q2 = (HaF32)(fVar8 * ((matrix->m_right).super_dgTemplateVector<float>.m_x -
                                 (matrix->m_front).super_dgTemplateVector<float>.m_z));
    this->m_q3 = (HaF32)(fVar8 * ((matrix->m_front).super_dgTemplateVector<float>.m_y -
                                 (matrix->m_up).super_dgTemplateVector<float>.m_x));
  }
  return;
}

Assistant:

dgQuaternion::dgQuaternion (const dgMatrix &matrix)
{
	enum QUAT_INDEX
	{
		X_INDEX=0,
		Y_INDEX=1,
		Z_INDEX=2
	};
	static QUAT_INDEX QIndex [] = {Y_INDEX, Z_INDEX, X_INDEX};

	hacd::HaF32 *ptr;
	hacd::HaF32 trace;
	QUAT_INDEX i;
	QUAT_INDEX j;
	QUAT_INDEX k;

	trace = matrix[0][0] + matrix[1][1] + matrix[2][2];
	if (trace > hacd::HaF32(0.0f)) {
		trace = dgSqrt (trace + hacd::HaF32(1.0f));
		m_q0 = hacd::HaF32 (0.5f) * trace;
		trace = hacd::HaF32 (0.5f) / trace;
		m_q1 = (matrix[1][2] - matrix[2][1]) * trace;
		m_q2 = (matrix[2][0] - matrix[0][2]) * trace;
		m_q3 = (matrix[0][1] - matrix[1][0]) * trace;

	} else {
		i = X_INDEX;
		if (matrix[Y_INDEX][Y_INDEX] > matrix[X_INDEX][X_INDEX]) {
			i = Y_INDEX;
		}
		if (matrix[Z_INDEX][Z_INDEX] > matrix[i][i]) {
			i = Z_INDEX;
		}
		j = QIndex [i];
		k = QIndex [j];

		trace = hacd::HaF32(1.0f) + matrix[i][i] - matrix[j][j] - matrix[k][k];
		trace = dgSqrt (trace);

		ptr = &m_q1;
		ptr[i] = hacd::HaF32 (0.5f) * trace;
		trace  = hacd::HaF32 (0.5f) / trace;
		m_q0   = (matrix[j][k] - matrix[k][j]) * trace;
		ptr[j] = (matrix[i][j] + matrix[j][i]) * trace;
		ptr[k] = (matrix[i][k] + matrix[k][i]) * trace;
	}

#ifdef _DEBUG
	dgMatrix tmp (*this, matrix.m_posit);
	dgMatrix unitMatrix (tmp * matrix.Inverse());
	for (hacd::HaI32 i = 0; i < 4; i ++) {
		hacd::HaF32 err = dgAbsf (unitMatrix[i][i] - hacd::HaF32(1.0f));
		HACD_ASSERT (err < hacd::HaF32 (1.0e-2f));
	}

	hacd::HaF32 err = dgAbsf (DotProduct(*this) - hacd::HaF32(1.0f));
	HACD_ASSERT (err < hacd::HaF32(dgEPSILON * 100.0f));
#endif
}